

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void print_raw_text(int f,string *s,v_array<char> tag)

{
  v_array<char> tag_00;
  long lVar1;
  ssize_t sVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  string *in_RSI;
  int in_EDI;
  void *in_stack_00000008;
  undefined8 in_stack_00000010;
  ssize_t t;
  ssize_t len;
  stringstream ss;
  int f_00;
  stringstream *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdc0;
  string *this;
  undefined8 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  string local_218 [32];
  ssize_t local_1f8;
  string local_1f0 [32];
  long local_1d0;
  stringstream local_198 [16];
  ostream local_188;
  
  if (-1 < in_EDI) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(&local_188,in_RSI);
    tag_00._end = (char *)in_stack_fffffffffffffdc8;
    tag_00._begin = (char *)in_stack_fffffffffffffdc0;
    tag_00.end_array._0_4_ = in_stack_fffffffffffffdd0;
    tag_00.end_array._4_4_ = in_stack_fffffffffffffdd4;
    tag_00.erase_count = (size_t)in_RSI;
    f_00 = in_stack_00000010._4_4_;
    print_tag(in_stack_fffffffffffffdb0,tag_00);
    std::operator<<(&local_188,'\n');
    std::__cxx11::stringstream::str();
    this = local_1f0;
    lVar1 = std::__cxx11::string::size();
    std::__cxx11::string::~string(this);
    local_1d0 = lVar1;
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sVar2 = io_buf::write_file_or_socket(f_00,in_stack_00000008,0x11dd54);
    std::__cxx11::string::~string(local_218);
    local_1f8 = sVar2;
    if (sVar2 != local_1d0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return;
}

Assistant:

void print_raw_text(int f, string s, v_array<char> tag)
{
  if (f < 0)
    return;

  std::stringstream ss;
  ss << s;
  print_tag(ss, tag);
  ss << '\n';
  ssize_t len = ss.str().size();
  ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
  if (t != len)
  {
    cerr << "write error: " << strerror(errno) << endl;
  }
}